

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O3

void __thiscall Assimp::FBXExporter::WriteAsciiHeader(FBXExporter *this)

{
  element_type *peVar1;
  ostream *poVar2;
  string ascii_header;
  stringstream head;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8 [2];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"; FBX ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_188,FBX::EXPORT_VERSION_STR_abi_cxx11_,DAT_008dd6a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," project file\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"; Created by the Open Asset Import Library (Assimp)\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"; http://assimp.org\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"; -------------------------------------------------\n",0x34);
  std::__cxx11::stringbuf::str();
  peVar1 = (this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_IOStream[3])(peVar1,local_1b8,local_1b0,1);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void FBXExporter::WriteAsciiHeader()
{
    // basically just a comment at the top of the file
    std::stringstream head;
    head << "; FBX " << EXPORT_VERSION_STR << " project file\n";
    head << "; Created by the Open Asset Import Library (Assimp)\n";
    head << "; http://assimp.org\n";
    head << "; -------------------------------------------------\n";
    const std::string ascii_header = head.str();
    outfile->Write(ascii_header.c_str(), ascii_header.size(), 1);
}